

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

VertexId __thiscall
S2Builder::EdgeChainSimplifier::FollowChain(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  const_reference cVar1;
  bool bVar2;
  EdgeId *pEVar3;
  Edge *pEVar4;
  ostream *poVar5;
  S2LogMessage local_78;
  int local_68;
  EdgeId local_64;
  VertexId v;
  EdgeId e;
  Iterator __end1;
  Iterator __begin1;
  VertexOutEdgeIds *__range1;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  VertexId local_18;
  VertexId local_14;
  VertexId v1_local;
  VertexId v0_local;
  EdgeChainSimplifier *this_local;
  
  local_18 = v1;
  local_14 = v0;
  _v1_local = this;
  cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_interior_,(long)v1);
  if (((cVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x63c,kFatal,(ostream *)&std::cerr);
    poVar5 = S2LogMessage::stream(&local_30);
    poVar5 = std::operator<<(poVar5,"Check failed: is_interior_[v1] ");
    S2LogMessageVoidify::operator&(&local_19,poVar5);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  ___end1 = Graph::VertexOutMap::edge_ids(&this->out_,local_18);
  e = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1);
  v = (VertexId)Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1);
  while( true ) {
    bVar2 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e,(Iterator *)&v);
    if (!bVar2) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x641,kFatal,(ostream *)&std::cerr);
      poVar5 = S2LogMessage::stream(&local_78);
      std::operator<<(poVar5,"Could not find next edge in edge chain");
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
    }
    pEVar3 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e);
    local_64 = *pEVar3;
    pEVar4 = Graph::edge(this->g_,local_64);
    local_68 = pEVar4->second;
    if ((local_68 != local_14) && (local_68 != local_18)) break;
    Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e);
  }
  return local_68;
}

Assistant:

S2Builder::Graph::VertexId S2Builder::EdgeChainSimplifier::FollowChain(
    VertexId v0, VertexId v1) const {
  S2_DCHECK(is_interior_[v1]);
  for (EdgeId e : out_.edge_ids(v1)) {
    VertexId v = g_.edge(e).second;
    if (v != v0 && v != v1) return v;
  }
  S2_LOG(FATAL) << "Could not find next edge in edge chain";
}